

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_basic_types.cpp
# Opt level: O0

bool Potassco::match(char **input,int *out)

{
  long lVar1;
  undefined4 *in_RSI;
  long *in_RDI;
  long t;
  char *eptr;
  char *local_20;
  undefined4 *local_18;
  long *local_10;
  bool local_1;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  lVar1 = strtol((char *)*in_RDI,&local_20,10);
  if (((local_20 == (char *)*local_10) || (lVar1 < -0x80000000)) || (0x7fffffff < lVar1)) {
    local_1 = false;
  }
  else {
    *local_18 = (int)lVar1;
    *local_10 = (long)local_20;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool match(const char*& input, int& out) {
	char* eptr;
	long t = std::strtol(input, &eptr, 10);
	if (eptr == input || t < INT_MIN || t > INT_MAX) {
		return false;
	}
	out = static_cast<int>(t);
	input = eptr;
	return true;
}